

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

ErrorGenerator *
anon_unknown.dwarf_7f1d8::ErrorMessages::InvalidObject
          (ErrorGenerator *__return_storage_ptr__,ObjectError param_1,Members *extraFields)

{
  anon_class_24_1_4c279d49 local_38;
  Members *local_20;
  Members *extraFields_local;
  ErrorGenerator *pEStack_10;
  ObjectError param_1_local;
  
  local_20 = extraFields;
  extraFields_local._4_4_ = param_1;
  pEStack_10 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38.extraFields,extraFields);
  std::function<void(Json::Value_const*,cmJSONState*)>::
  function<(anonymous_namespace)::ErrorMessages::InvalidObject(JsonErrors::ObjectError,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
            ((function<void(Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,&local_38);
  (anonymous_namespace)::ErrorMessages::
  InvalidObject(JsonErrors::ObjectError,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::~__0((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ErrorGenerator InvalidObject(JsonErrors::ObjectError /*errorType*/,
                             const Json::Value::Members& extraFields)
{
  return [extraFields](const Json::Value* value, cmJSONState* state) -> void {
    state->AddErrorAtValue("Invalid Object", value);
  };
}